

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.cpp
# Opt level: O1

void __thiscall libDAI::MaxPlus::updateMessage(MaxPlus *this,size_t iI)

{
  double dVar1;
  undefined1 auVar2 [16];
  pointer pTVar3;
  long lVar4;
  long lVar5;
  pointer pTVar6;
  double dVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  dVar1 = (this->Props).damping;
  if (dVar1 <= 1e-05) {
    pTVar3 = (this->_messages).
             super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar6 = (this->_newmessages).
             super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pTVar3 != pTVar6) {
      std::vector<double,_std::allocator<double>_>::operator=(&pTVar3[iI]._p,&pTVar6[iI]._p);
      return;
    }
  }
  else {
    pTVar3 = (this->_messages).
             super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar4 = *(long *)&pTVar3[iI]._p.super__Vector_base<double,_std::allocator<double>_>._M_impl;
    lVar8 = (long)*(pointer *)
                   ((long)&pTVar3[iI]._p.super__Vector_base<double,_std::allocator<double>_>._M_impl
                   + 8) - lVar4;
    if (lVar8 != 0) {
      lVar8 = lVar8 >> 3;
      lVar5 = *(long *)&(this->_newmessages).
                        super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iI]._p.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl;
      lVar9 = 0;
      do {
        dVar7 = dVar1 * *(double *)(lVar4 + lVar9 * 8);
        *(double *)(lVar4 + lVar9 * 8) = dVar7;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *(ulong *)(lVar5 + lVar9 * 8);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = 1.0 - dVar1;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = dVar7;
        auVar2 = vfmadd231sd_fma(auVar11,auVar10,auVar2);
        *(long *)(lVar4 + lVar9 * 8) = auVar2._0_8_;
        lVar9 = lVar9 + 1;
      } while (lVar8 + (ulong)(lVar8 == 0) != lVar9);
    }
  }
  return;
}

Assistant:

void MaxPlus::updateMessage(size_t iI) {
        if( Props.damping <= 0.00001 )
        {
#if DEBUG_DAMP
            cout << " MaxPlus::updateMessage - No damping" << endl;
#endif            
            _messages[iI] = _newmessages[iI];
        }
        else
        {
            //this does not work correctly for arbitrary numbers
            //_messages[iI] = (_messages[iI] ^ Props.damping) * (_newmessages[iI] ^ (1.0 - Props.damping));
            //rather use regular pointwise multiplication
#if DEBUG_DAMP
            cout << " MaxPlus::updateMessage - using damping, damp factor=" << 
                Props.damping<<"..."<<endl;
            cout << "old messages     " << _messages[iI] << endl;
            cout << "new messages     " << _newmessages[iI] << endl;            
#endif            
            //inlined this code to speed it up (no need to create new 
            //vectors etc.)
            //_messages[iI] = (_messages[iI] * Props.damping) + (_newmessages[iI] * (1.0 - Props.damping));
            Prob & this_message = _messages[iI];
            Prob & new_message = _newmessages[iI];
            double d = Props.damping;
            double nd = 1.0 - d;
            for(size_t i=0; i < this_message.size(); i++)
            {
                this_message[i] *= d;
                this_message[i] += nd * new_message[i];
            }
                 

#if DEBUG_DAMP
            cout << "updated messages " << _messages[iI] << endl;            
#endif            
        }
    }